

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this,int i,int j,int k)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  allocator<char> local_1d;
  int local_1c;
  int local_18;
  int k_local;
  int j_local;
  int i_local;
  Matrix *this_local;
  
  local_1c = k;
  local_18 = j;
  k_local = i;
  _j_local = this;
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0018f6e8;
  boost::shared_array<double>::shared_array(&this->matrixParent);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sMatrixName,"data",&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  this->nMatrixDimension = 3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->nMatrixDimension;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->pSize = piVar3;
  *this->pSize = k_local;
  this->pSize[1] = local_18;
  this->pSize[2] = local_1c;
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix(int i, int j, int k) : sMatrixName("data") 
 { 
	nMatrixDimension = 3;
	pSize = new int[nMatrixDimension];
	pSize[0] = i;
	pSize[1] = j;
	pSize[2] = k;
	bReference = false;
	init();
}